

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32.h
# Opt level: O3

int SetPWMSSC32(SSC32 *pSSC32,int channel,int pw)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  char sendbuf [512];
  uint8 auStack_238 [520];
  
  iVar2 = (int)((double)(pw + -0x5dc) * pSSC32->CoefPWs[channel]);
  if (pSSC32->bProportionalPWs[channel] == 0) {
    uVar3 = iVar2 + 0x5dc;
  }
  else {
    iVar4 = pSSC32->MidPWs[channel];
    if (iVar2 < 0) {
      iVar2 = (int)((ulong)((long)((pSSC32->MinPWs[channel] - iVar4) * iVar2) * -0x10624dd3) >> 0x20
                   );
    }
    else {
      iVar2 = (int)((ulong)((long)((pSSC32->MaxPWs[channel] - iVar4) * iVar2) * 0x10624dd3) >> 0x20)
      ;
    }
    uVar3 = ((iVar2 >> 5) - (iVar2 >> 0x1f)) + iVar4;
  }
  uVar1 = pSSC32->MaxPWs[channel];
  if ((int)uVar3 < pSSC32->MaxPWs[channel]) {
    uVar1 = uVar3;
  }
  if ((int)uVar1 <= pSSC32->MinPWs[channel]) {
    uVar1 = pSSC32->MinPWs[channel];
  }
  iVar4 = uVar1 - pSSC32->LastPWs[channel];
  iVar2 = -iVar4;
  if (0 < iVar4) {
    iVar2 = iVar4;
  }
  iVar4 = 0;
  if (pSSC32->ThresholdPWs[channel] <= iVar2) {
    memset(auStack_238,0,0x200);
    sprintf((char *)auStack_238,"#%dP%d\r",channel,(ulong)uVar1);
    sVar5 = strlen((char *)auStack_238);
    iVar2 = WriteDataSSC32(pSSC32,auStack_238,(int)sVar5,pSSC32->bytedelayus);
    if (iVar2 == 0) {
      if ((pSSC32->bSaveRawData != 0) && ((FILE *)pSSC32->pfSaveFile != (FILE *)0x0)) {
        fwrite(auStack_238,(long)(int)sVar5,1,(FILE *)pSSC32->pfSaveFile);
        fflush((FILE *)pSSC32->pfSaveFile);
      }
      pSSC32->LastPWs[channel] = uVar1;
      iVar4 = 0;
    }
    else {
      puts("Error writing data to a SSC32. ");
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

inline int SetPWMSSC32(SSC32* pSSC32, int channel, int pw)
{
	char sendbuf[MAX_NB_BYTES_SSC32];
	int sendbuflen = 0;

	if (pSSC32->bProportionalPWs[channel])
	{
		pw = (int)(pSSC32->CoefPWs[channel]*(pw-DEFAULT_MID_PW_SSC32));
		if (pw >= 0)
			pw = pSSC32->MidPWs[channel]+pw*(pSSC32->MaxPWs[channel]-pSSC32->MidPWs[channel])
			/(DEFAULT_MAX_PW_SSC32-DEFAULT_MID_PW_SSC32);
		else
			pw = pSSC32->MidPWs[channel]+pw*(pSSC32->MinPWs[channel]-pSSC32->MidPWs[channel])
			/(DEFAULT_MIN_PW_SSC32-DEFAULT_MID_PW_SSC32);
	}
	else
	{
		pw = DEFAULT_MID_PW_SSC32+(int)(pSSC32->CoefPWs[channel]*(pw-DEFAULT_MID_PW_SSC32));
	}

	pw = max(min(pw, pSSC32->MaxPWs[channel]), pSSC32->MinPWs[channel]);
	//pw = max(min(pw, DEFAULT_ABSOLUTE_MAX_PW_SSC32), DEFAULT_ABSOLUTE_MIN_PW_SSC32);

	// The requested PWM is only applied if it is slightly different from the current value.
	if (abs(pw-pSSC32->LastPWs[channel]) < pSSC32->ThresholdPWs[channel]) return EXIT_SUCCESS;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sprintf(sendbuf, "#%dP%d\r", channel, pw);
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataSSC32(pSSC32, (unsigned char*)sendbuf, sendbuflen, pSSC32->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a SSC32. \n");
		return EXIT_FAILURE;
	}
	if ((pSSC32->bSaveRawData)&&(pSSC32->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pSSC32->pfSaveFile);
		fflush(pSSC32->pfSaveFile);
	}

	// Update last known value.
	pSSC32->LastPWs[channel] = pw;

	return EXIT_SUCCESS;
}